

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroup.hpp
# Opt level: O0

void __thiscall OpenMD::CutoffGroup::updateCOM(CutoffGroup *this)

{
  uint uVar1;
  Snapshot *pSVar2;
  size_type sVar3;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *in_RDI;
  Vector<double,_3U> *s;
  RealType totalMass;
  Atom *atom;
  iterator i;
  bool needsVel;
  DataStorage *data;
  Vector<double,_3U> *in_stack_ffffffffffffff18;
  Vector<double,_3U> *in_stack_ffffffffffffff20;
  Vector<double,_3U> *this_00;
  StuntDouble *in_stack_ffffffffffffff28;
  CutoffGroup *in_stack_ffffffffffffff30;
  CutoffGroup *in_stack_ffffffffffffff40;
  Atom *local_58;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_50 [7];
  byte local_11;
  DataStorage *local_10;
  
  pSVar2 = SnapshotManager::getCurrentSnapshot
                     ((SnapshotManager *)
                      in_RDI[2].super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  local_10 = (DataStorage *)
             ((long)&(pSVar2->atomData).position.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
             (long)in_RDI[2].super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  local_11 = 0;
  uVar1 = DataStorage::getStorageLayout(local_10);
  if ((uVar1 & 2) != 0) {
    local_11 = 1;
  }
  sVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size(in_RDI);
  if (sVar3 == 1) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[](in_RDI,0);
    StuntDouble::getPos(in_stack_ffffffffffffff28);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (&local_10->position,
               (long)*(int *)((long)&in_RDI[1].
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffff20,
               (Vector3<double> *)in_stack_ffffffffffffff18);
    if ((local_11 & 1) != 0) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[](in_RDI,0);
      StuntDouble::getVel(in_stack_ffffffffffffff28);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&local_10->velocity,
                 (long)*(int *)((long)&in_RDI[1].
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffff20,
                 (Vector3<double> *)in_stack_ffffffffffffff18);
    }
  }
  else {
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(local_50);
    s = (Vector<double,_3U> *)getMass(in_stack_ffffffffffffff30);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (&local_10->position,
               (long)*(int *)((long)&in_RDI[1].
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffff20,
               (Vector3<double> *)in_stack_ffffffffffffff18);
    if ((local_11 & 1) != 0) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&local_10->velocity,
                 (long)*(int *)((long)&in_RDI[1].
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffff20,
                 (Vector3<double> *)in_stack_ffffffffffffff18);
    }
    local_58 = beginAtom(in_stack_ffffffffffffff40,(iterator *)in_RDI);
    while (local_58 != (Atom *)0x0) {
      StuntDouble::getMass(&local_58->super_StuntDouble);
      StuntDouble::getPos(in_stack_ffffffffffffff28);
      OpenMD::operator*((double)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&local_10->position,
                 (long)*(int *)((long)&in_RDI[1].
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      Vector<double,_3U>::operator+=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if ((local_11 & 1) != 0) {
        in_stack_ffffffffffffff28 =
             (StuntDouble *)StuntDouble::getMass(&local_58->super_StuntDouble);
        StuntDouble::getVel(in_stack_ffffffffffffff28);
        OpenMD::operator*((double)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (&local_10->velocity,
                   (long)*(int *)((long)&in_RDI[1].
                                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        Vector<double,_3U>::operator+=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      local_58 = nextAtom(in_stack_ffffffffffffff40,(iterator *)in_RDI);
    }
    this_00 = s;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (&local_10->position,
               (long)*(int *)((long)&in_RDI[1].
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    Vector<double,_3U>::operator/=(this_00,(double)in_stack_ffffffffffffff18);
    if ((local_11 & 1) != 0) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&local_10->velocity,
                 (long)*(int *)((long)&in_RDI[1].
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      Vector<double,_3U>::operator/=(this_00,(double)s);
    }
  }
  return;
}

Assistant:

void updateCOM() {
      DataStorage& data = snapshotMan_->getCurrentSnapshot()->*storage_;
      bool needsVel     = false;
      if (data.getStorageLayout() & DataStorage::dslVelocity) needsVel = true;

      if (cutoffAtomList.size() == 1) {
        data.position[localIndex_] = cutoffAtomList[0]->getPos();
        if (needsVel) data.velocity[localIndex_] = cutoffAtomList[0]->getVel();
      } else {
        std::vector<Atom*>::iterator i;
        Atom* atom;
        RealType totalMass         = getMass();
        data.position[localIndex_] = V3Zero;
        if (needsVel) data.velocity[localIndex_] = V3Zero;

        for (atom = beginAtom(i); atom != NULL; atom = nextAtom(i)) {
          data.position[localIndex_] += atom->getMass() * atom->getPos();
          if (needsVel)
            data.velocity[localIndex_] += atom->getMass() * atom->getVel();
        }
        data.position[localIndex_] /= totalMass;
        if (needsVel) data.velocity[localIndex_] /= totalMass;
      }
    }